

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O0

bool __thiscall CalibrateGyro::CalculateM(CalibrateGyro *this)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  double index;
  double row;
  double dVar3;
  double startRow;
  double dVar4;
  double PI_2;
  exception *e;
  int i;
  int num [6];
  Vector3d RotationAngle [6];
  bool flag;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdc8;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,__1,__1,_false> *this_00;
  Index in_stack_fffffffffffffdd8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffde0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_01;
  Index in_stack_fffffffffffffde8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1> *in_stack_fffffffffffffdf0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1> *this_02;
  Scalar startCol;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this_03;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffe18;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffe20;
  Scalar SVar5;
  int *in_stack_fffffffffffffe38;
  Vector3d *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  VecVector3d *in_stack_fffffffffffffe50;
  CalibrateGyro *in_stack_fffffffffffffe58;
  undefined1 *local_180;
  CalibrateGyro *in_stack_fffffffffffffea8;
  int local_cc;
  undefined1 local_a8 [144];
  undefined1 auStack_18 [7];
  undefined1 local_11;
  bool local_1;
  
  local_11 = CalculateBias(in_stack_fffffffffffffea8);
  if ((bool)local_11) {
    local_180 = local_a8;
    do {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a403b);
      local_180 = local_180 + 0x18;
    } while (local_180 != auStack_18);
    for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
      if (local_cc < 2) {
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        CalculateRotation(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffffde0);
      }
      else if ((local_cc < 2) || (3 < local_cc)) {
        if ((3 < local_cc) && (local_cc < 6)) {
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::vector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          CalculateRotation(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                            (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                            in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffde0);
        }
      }
      else {
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        CalculateRotation(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffffde0);
      }
    }
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    this_00 = (Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,__1,__1,_false> *)*pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    index = (((double)this_00 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (Index)in_stack_fffffffffffffde0);
    *pSVar2 = index;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffde0,(Index)index);
    this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)*pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    row = (((double)this_01 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (in_stack_fffffffffffffdf0,(Index)row,(Index)this_01);
    *pSVar2 = row;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    this_02 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1> *)*pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar3 = (((double)this_02 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = dVar3;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    startCol = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    startRow = ((startCol - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = startRow;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    this_03 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)*pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = (((double)this_03 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = dVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    SVar5 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = *pSVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = ((SVar5 - dVar4) / 6.283185307179586) / 2.0;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = ((dVar4 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = dVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    SVar5 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = ((SVar5 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = dVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    SVar5 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_01,(Index)index);
    dVar4 = ((SVar5 - *pSVar1) / 6.283185307179586) / 2.0;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1>::operator()
                       (this_02,(Index)row,(Index)this_01);
    *pSVar2 = dVar4;
    Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<int,int>
              (this_03,(Index)startRow,(Index)startCol,(int)((ulong)dVar3 >> 0x20),SUB84(dVar3,0));
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,-1,-1,false>::operator=
              (this_00,in_stack_fffffffffffffdc8);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CalibrateGyro::CalculateM()
{
    bool flag = CalculateBias();
    if(!flag)
        return false;
    Vector3d RotationAngle[6];
    int num[6];
    try
    {
        for(int i = 0; i < 6; ++i)
        {
            if(i <= 1)
                this->CalculateRotation(this->Gyro_Kinematic[i], 0, RotationAngle[i], num[i]);
            else if(i >= 2 && i < 4)
                this->CalculateRotation(this->Gyro_Kinematic[i], 1, RotationAngle[i], num[i]);
            else if(i >= 4 && i < 6)
                this->CalculateRotation(this->Gyro_Kinematic[i], 2, RotationAngle[i], num[i]);
        }
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }
    
    double PI_2 = PI * 2;
    M(0, 0) = (RotationAngle[0][0] - RotationAngle[1][0]) / PI_2 / 2;   // X axis scale factor
    M(1, 1) = (RotationAngle[2][1] - RotationAngle[3][1]) / PI_2 / 2;   // Y axis scale factor
    M(2, 2) = (RotationAngle[4][2] - RotationAngle[5][2]) / PI_2 / 2;   // Z axis scale factor

    M(0, 1) = (RotationAngle[2][0] - RotationAngle[3][0]) / PI_2 / 2;   // yx
    M(0, 2) = (RotationAngle[4][0] - RotationAngle[5][0]) / PI_2 / 2;   // zx

    M(1, 0) = (RotationAngle[0][1] - RotationAngle[1][1]) / PI_2 / 2;   // xy
    M(1, 2) = (RotationAngle[4][1] - RotationAngle[5][1]) / PI_2 / 2;   // zy

    M(2, 0) = (RotationAngle[0][2] - RotationAngle[1][2]) / PI_2 / 2;   // xz
    M(2, 1) = (RotationAngle[2][2] - RotationAngle[3][2]) / PI_2 / 2;   // yz

    // M.block(0, 0, 3, 3) += Matrix3d::Identity();
    M.block(0, 3, 3, 1) = this->Bias;
    return true;
}